

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

void __thiscall re2::NFA::~NFA(NFA *this)

{
  undefined8 *puVar1;
  long in_RDI;
  Thread *t;
  Thread *next;
  SparseArray<re2::NFA::Thread_*> *in_stack_ffffffffffffffd0;
  undefined8 *local_18;
  
  if (*(void **)(in_RDI + 0x90) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x90));
  }
  puVar1 = *(undefined8 **)(in_RDI + 0x88);
  while (local_18 = puVar1, local_18 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*local_18;
    in_stack_ffffffffffffffd0 = (SparseArray<re2::NFA::Thread_*> *)local_18[1];
    if (in_stack_ffffffffffffffd0 != (SparseArray<re2::NFA::Thread_*> *)0x0) {
      operator_delete__(in_stack_ffffffffffffffd0);
    }
    if (local_18 != (undefined8 *)0x0) {
      operator_delete(local_18);
    }
  }
  PODArray<re2::NFA::AddState>::~PODArray((PODArray<re2::NFA::AddState> *)0x24df17);
  SparseArray<re2::NFA::Thread_*>::~SparseArray(in_stack_ffffffffffffffd0);
  SparseArray<re2::NFA::Thread_*>::~SparseArray(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

NFA::~NFA() {
  delete[] match_;
  Thread* next;
  for (Thread* t = free_threads_; t; t = next) {
    next = t->next;
    delete[] t->capture;
    delete t;
  }
}